

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  short sVar1;
  ushort uVar2;
  u16 uVar3;
  int iVar4;
  Table *pTab;
  sqlite3 *db;
  Schema *pSVar5;
  Column *pCVar6;
  LogEst LVar7;
  int iVar8;
  void *pvVar9;
  Vdbe *pVVar10;
  Parse *pPVar11;
  Table *pTable;
  Token *pTVar12;
  size_t sVar13;
  Expr *pExpr;
  ExprList *pList;
  int iVar14;
  uint uVar15;
  Schema **ppSVar16;
  Op *pOVar17;
  u8 *puVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  char *pcVar22;
  short *psVar23;
  char *pcVar24;
  short *psVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  Index *pIVar29;
  int iVar30;
  Index *unaff_R13;
  Op *pOVar31;
  bool bVar32;
  char cVar33;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if ((db->init).busy != '\0') {
    if (pSelect != (Select *)0x0) {
      pcVar22 = "";
      goto LAB_00167a49;
    }
    iVar30 = (db->init).newTnum;
    pTab->tnum = iVar30;
    if (iVar30 == 1) {
      *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
    }
  }
  if ((tabOpts & 0x20) != 0) {
    uVar15 = pTab->tabFlags;
    if ((uVar15 & 8) != 0) {
      pcVar22 = "AUTOINCREMENT not allowed on WITHOUT ROWID tables";
LAB_00167a49:
      sqlite3ErrorMsg(pParse,pcVar22);
      return;
    }
    if ((uVar15 & 4) == 0) {
      sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
    }
    else {
      pTab->tabFlags = uVar15 | 0x60;
      pVVar10 = pParse->pVdbe;
      if ((((db->init).field_0x6 & 2) == 0) && (sVar1 = pTab->nCol, 0 < (long)sVar1)) {
        pCVar6 = pTab->aCol;
        lVar19 = 0;
        do {
          if (((&pCVar6->colFlags)[lVar19] & 1) != 0) {
            (&pCVar6->notNull)[lVar19] = '\x02';
          }
          lVar19 = lVar19 + 0x20;
        } while ((long)sVar1 * 0x20 != lVar19);
      }
      iVar30 = pParse->addrCrTab;
      if (iVar30 != 0) {
        if (iVar30 < 0) {
          iVar30 = pVVar10->nOp + -1;
        }
        if (pVVar10->db->mallocFailed == '\0') {
          pOVar17 = pVVar10->aOp + iVar30;
        }
        else {
          pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar17->p3 = 2;
      }
      if ((long)pTab->iPKey < 0) {
        for (unaff_R13 = pTab->pIndex;
            (unaff_R13 != (Index *)0x0 && ((*(ushort *)&unaff_R13->field_0x63 & 3) != 2));
            unaff_R13 = unaff_R13->pNext) {
        }
        iVar30 = 1;
        if (1 < unaff_R13->nKeyCol) {
          psVar23 = unaff_R13->aiColumn;
          iVar30 = 1;
          uVar20 = 1;
          do {
            psVar25 = psVar23;
            iVar14 = iVar30;
            do {
              iVar8 = iVar14;
              if (iVar8 < 1) goto LAB_00167ccd;
              sVar1 = *psVar25;
              psVar25 = psVar25 + 1;
              iVar14 = iVar8 + -1;
            } while (sVar1 != psVar23[uVar20]);
            if (iVar8 < 1) {
LAB_00167ccd:
              lVar19 = (long)iVar30;
              iVar30 = iVar30 + 1;
              psVar23[lVar19] = psVar23[uVar20];
            }
            else {
              unaff_R13->nColumn = unaff_R13->nColumn - 1;
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < unaff_R13->nKeyCol);
        }
        unaff_R13->nKeyCol = (u16)iVar30;
      }
      else {
        dest._0_8_ = pTab->aCol[pTab->iPKey].zName;
        if ((char *)dest._0_8_ == (char *)0x0) {
          uVar15 = 0;
        }
        else {
          sVar13 = strlen((char *)dest._0_8_);
          uVar15 = (uint)sVar13 & 0x3fffffff;
        }
        dest.iSdst = uVar15;
        bVar32 = false;
        pExpr = sqlite3ExprAlloc(db,0x3b,(Token *)&dest,0);
        pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pExpr);
        if (pList != (ExprList *)0x0) {
          pList->a[0].sortOrder = pParse->iPkSortOrder;
          sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,
                             (uint)pTab->keyConf,(Token *)0x0,(Expr *)0x0,0,0,'\x02');
          if (db->mallocFailed == '\0') {
            if (pParse->nErr == 0) {
              for (unaff_R13 = pTab->pIndex;
                  (unaff_R13 != (Index *)0x0 && ((*(ushort *)&unaff_R13->field_0x63 & 3) != 2));
                  unaff_R13 = unaff_R13->pNext) {
              }
              pTab->iPKey = -1;
              bVar32 = true;
            }
            else {
              bVar32 = false;
            }
          }
        }
        if (!bVar32) goto LAB_00167639;
      }
      uVar2 = *(ushort *)&unaff_R13->field_0x63;
      *(ushort *)&unaff_R13->field_0x63 = uVar2 | 0x20;
      if (((db->init).field_0x6 & 2) == 0) {
        *(ushort *)&unaff_R13->field_0x63 = uVar2 | 0x28;
      }
      uVar2 = unaff_R13->nKeyCol;
      uVar20 = (ulong)uVar2;
      if ((pVVar10 != (Vdbe *)0x0) && (0 < (long)unaff_R13->tnum)) {
        if (pVVar10->db->mallocFailed == '\0') {
          pOVar17 = pVVar10->aOp + unaff_R13->tnum;
        }
        else {
          pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar17->opcode = '\v';
      }
      unaff_R13->tnum = pTab->tnum;
      for (pIVar29 = pTab->pIndex; pIVar29 != (Index *)0x0; pIVar29 = pIVar29->pNext) {
        cVar33 = '\n';
        if ((*(ushort *)&pIVar29->field_0x63 & 3) != 2) {
          if (uVar20 == 0) {
            iVar30 = 0;
          }
          else {
            uVar26 = 0;
            iVar30 = 0;
            do {
              psVar23 = pIVar29->aiColumn;
              uVar15 = (uint)pIVar29->nKeyCol;
              do {
                uVar21 = uVar15;
                if ((int)uVar21 < 1) break;
                sVar1 = *psVar23;
                psVar23 = psVar23 + 1;
                uVar15 = uVar21 - 1;
              } while (sVar1 != unaff_R13->aiColumn[uVar26]);
              iVar30 = iVar30 + (uint)((int)uVar21 < 1);
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar20);
          }
          if (iVar30 == 0) {
            pIVar29->nColumn = pIVar29->nKeyCol;
          }
          else {
            iVar30 = resizeIndexObject(db,pIVar29,iVar30 + (uint)pIVar29->nKeyCol);
            cVar33 = iVar30 != 0;
            if ((!(bool)cVar33) && (uVar2 != 0)) {
              uVar15 = (uint)pIVar29->nKeyCol;
              uVar26 = 0;
              do {
                psVar23 = pIVar29->aiColumn;
                uVar21 = (uint)pIVar29->nKeyCol;
                do {
                  uVar27 = uVar21;
                  if ((int)uVar27 < 1) goto LAB_00167ed5;
                  sVar1 = *psVar23;
                  psVar23 = psVar23 + 1;
                  uVar21 = uVar27 - 1;
                } while (sVar1 != unaff_R13->aiColumn[uVar26]);
                if ((int)uVar27 < 1) {
LAB_00167ed5:
                  pIVar29->aiColumn[(int)uVar15] = unaff_R13->aiColumn[uVar26];
                  pIVar29->azColl[(int)uVar15] = unaff_R13->azColl[uVar26];
                  uVar15 = uVar15 + 1;
                }
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar20);
              cVar33 = '\0';
            }
          }
        }
        if ((cVar33 != '\n') && (cVar33 != '\0')) goto LAB_00167639;
      }
      uVar3 = pTab->nCol;
      if ((int)(uint)uVar2 < (int)(short)uVar3) {
        iVar30 = resizeIndexObject(db,unaff_R13,(int)(short)uVar3);
        if (iVar30 != 0) goto LAB_00167639;
        if (0 < pTab->nCol) {
          iVar30 = 0;
          do {
            iVar14 = (int)uVar20;
            psVar23 = unaff_R13->aiColumn;
            uVar26 = uVar20;
            do {
              iVar8 = (int)uVar26;
              if (iVar8 < 1) goto LAB_00167f7c;
              uVar26 = (ulong)(iVar8 - 1);
              sVar1 = *psVar23;
              psVar23 = psVar23 + 1;
            } while (iVar30 != sVar1);
            if (iVar8 < 1) {
LAB_00167f7c:
              unaff_R13->aiColumn[iVar14] = (short)iVar30;
              unaff_R13->azColl[iVar14] = "BINARY";
              uVar20 = (ulong)(iVar14 + 1);
            }
            iVar30 = iVar30 + 1;
          } while (iVar30 < pTab->nCol);
        }
      }
      else {
        unaff_R13->nColumn = uVar3;
      }
      if ((ulong)unaff_R13->nColumn == 0) {
        uVar20 = 0xffffffffffffffff;
      }
      else {
        lVar19 = (ulong)unaff_R13->nColumn + 1;
        uVar20 = 0;
        do {
          uVar26 = 1L << ((byte)unaff_R13->aiColumn[lVar19 + -2] & 0x3f);
          if (0x3e < (ushort)unaff_R13->aiColumn[lVar19 + -2]) {
            uVar26 = 0;
          }
          uVar20 = uVar20 | uVar26;
          lVar19 = lVar19 + -1;
        } while (1 < lVar19);
        uVar20 = ~uVar20;
      }
      unaff_R13->colNotIdxed = uVar20;
    }
  }
LAB_00167639:
  if (pTab->pSchema == (Schema *)0x0) {
    iVar30 = -1000000;
  }
  else {
    iVar30 = -1;
    ppSVar16 = &db->aDb->pSchema;
    do {
      iVar30 = iVar30 + 1;
      pSVar5 = *ppSVar16;
      ppSVar16 = ppSVar16 + 4;
    } while (pSVar5 != pTab->pSchema);
  }
  if (pTab->pCheck != (ExprList *)0x0) {
    sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
  }
  if (pTab->nCol < 1) {
    iVar14 = 0;
  }
  else {
    iVar8 = pTab->nCol + 1;
    puVar18 = &pTab->aCol->szEst;
    iVar14 = 0;
    do {
      iVar14 = iVar14 + (uint)*puVar18;
      iVar8 = iVar8 + -1;
      puVar18 = puVar18 + 0x20;
    } while (1 < iVar8);
  }
  LVar7 = sqlite3LogEst((ulong)(((uint)((ushort)pTab->iPKey >> 0xf) + iVar14) * 4));
  pTab->szTabRow = LVar7;
  for (pIVar29 = pTab->pIndex; pIVar29 != (Index *)0x0; pIVar29 = pIVar29->pNext) {
    estimateIndexWidth(pIVar29);
  }
  if ((db->init).busy == '\0') {
    pVVar10 = sqlite3GetVdbe(pParse);
    if (pVVar10 == (Vdbe *)0x0) {
      return;
    }
    sqlite3VdbeAddOp3(pVVar10,0x75,0,0,0);
    bVar32 = pTab->pSelect == (Select *)0x0;
    pcVar22 = "VIEW";
    if (bVar32) {
      pcVar22 = "TABLE";
    }
    pcVar24 = "view";
    if (bVar32) {
      pcVar24 = "table";
    }
    if (pSelect == (Select *)0x0) {
      pTVar12 = &pParse->sLastToken;
      if (tabOpts == '\0') {
        pTVar12 = pEnd;
      }
      uVar15 = (int)pTVar12->z - (int)(pParse->sNameToken).z;
      if (*pTVar12->z != ';') {
        uVar15 = uVar15 + pTVar12->n;
      }
      pcVar22 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar22,(ulong)uVar15);
    }
    else {
      iVar14 = pParse->nMem;
      iVar28 = iVar14 + 1;
      iVar8 = iVar14 + 3;
      pParse->nMem = iVar8;
      pPVar11 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar11 = pParse;
      }
      pPVar11->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar10,0x6e,1,pParse->regRoot,iVar30);
      iVar4 = pVVar10->nOp;
      if (0 < (long)iVar4) {
        pVVar10->aOp[(long)iVar4 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar10,0xd,iVar28,0,iVar4 + 1);
      if (pParse->nErr != 0) {
        return;
      }
      pTable = sqlite3ResultSetOfSelect(pParse,pSelect);
      if (pTable == (Table *)0x0) {
        return;
      }
      pTab->nCol = pTable->nCol;
      pTab->aCol = pTable->aCol;
      pTable->nCol = 0;
      pTable->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTable);
      dest.eDest = '\r';
      dest.iSDParm = iVar28;
      dest.iSdst = 0;
      dest.nSdst = 0;
      dest.zAffSdst = (char *)0x0;
      sqlite3Select(pParse,pSelect,&dest);
      if (pParse->nErr != 0) {
        return;
      }
      sqlite3VdbeAddOp3(pVVar10,0x43,iVar28,0,0);
      pPVar11 = pVVar10->pParse;
      pPVar11->nTempReg = '\0';
      pPVar11->nRangeReg = 0;
      pOVar31 = (Op *)&sqlite3VdbeGetOp_dummy;
      pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (pVVar10->db->mallocFailed == '\0') {
        iVar28 = pVVar10->nOp + -1;
        if (-1 < iVar4) {
          iVar28 = iVar4;
        }
        pOVar17 = pVVar10->aOp + iVar28;
      }
      pOVar17->p2 = pVVar10->nOp;
      iVar28 = sqlite3VdbeAddOp3(pVVar10,0xe,dest.iSDParm,0,0);
      sqlite3VdbeAddOp3(pVVar10,0x66,dest.iSdst,dest.nSdst,iVar14 + 2);
      sqlite3TableAffinity(pVVar10,pTab,0);
      sqlite3VdbeAddOp3(pVVar10,0x79,1,iVar8,0);
      sqlite3VdbeAddOp3(pVVar10,0x7a,1,iVar14 + 2,iVar8);
      sqlite3VdbeAddOp3(pVVar10,0xb,0,iVar28,0);
      if (pVVar10->db->mallocFailed == '\0') {
        iVar14 = pVVar10->nOp + -1;
        if (-1 < iVar28) {
          iVar14 = iVar28;
        }
        pOVar31 = pVVar10->aOp + iVar14;
      }
      pOVar31->p2 = pVVar10->nOp;
      sqlite3VdbeAddOp3(pVVar10,0x75,1,0,0);
      pcVar22 = createTableStmt(db,pTab);
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar30].zDbSName,"sqlite_master",pcVar24,pTab->zName,pTab->zName,
                       (ulong)(uint)pParse->regRoot,pcVar22,(ulong)(uint)pParse->regRowid);
    if (pcVar22 != (char *)0x0) {
      sqlite3DbFreeNN(db,pcVar22);
    }
    sqlite3ChangeCookie(pParse,iVar30);
    if (((pTab->tabFlags & 8) != 0) && ((db->aDb[iVar30].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar30].zDbSName
                        );
    }
    pcVar22 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar10,iVar30,pcVar22);
  }
  if ((db->init).busy != '\0') {
    pvVar9 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
    if (pvVar9 == (void *)0x0) {
      pParse->pNewTable = (Table *)0x0;
      *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
      if (pTab->pSelect == (Select *)0x0) {
        pcVar22 = (pParse->sNameToken).z;
        if (pCons->z != (char *)0x0) {
          pEnd = pCons;
        }
        iVar30 = sqlite3Utf8CharLen(pcVar22,*(int *)&pEnd->z - (int)pcVar22);
        pTab->addColOffset = iVar30 + 0xd;
      }
    }
    else if ((db->mallocFailed == '\0') && (db->bBenignMalloc == '\0')) {
      db->mallocFailed = '\x01';
      if (0 < db->nVdbeExec) {
        (db->u1).isInterrupted = 1;
      }
      (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    if( pSelect ){
      sqlite3ErrorMsg(pParse, "");
      return;
    }
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      if( pParse->nErr ) return;
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->mDbFlags |= DBFLAG_SchemaChange;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}